

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall crnlib::mipmapped_texture::vertical_cross_to_cubemap(mipmapped_texture *this)

{
  uint uVar1;
  int iVar2;
  image_u8 *piVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  image_u8 *piVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint x;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  image_u8 tmp_img;
  mipmapped_texture cubemap;
  
  if ((((this->m_faces).m_size == 1) && (uVar1 = this->m_height, uVar1 - 1 < (uVar1 ^ uVar1 - 1)))
     && (uVar15 = this->m_width, (uVar15 ^ uVar15 - 1) <= uVar15 - 1)) {
    bVar18 = uVar1 >> 2 == uVar15 / 3;
  }
  else {
    bVar18 = false;
  }
  if (bVar18) {
    uVar1 = this->m_height;
    uVar15 = uVar1 >> 2;
    has_alpha(this);
    cubemap.m_name.m_buf_size = 0;
    cubemap.m_name.m_len = 0;
    cubemap.m_name.m_pStr = (char *)0x0;
    cubemap.m_width = 0;
    cubemap.m_height = 0;
    cubemap.m_comp_flags = cDefaultCompFlags;
    cubemap._28_8_ = 0;
    cubemap.m_faces._4_8_ = 0;
    cubemap.m_faces.m_capacity = 0;
    cubemap.m_source_file_type = cFormatInvalid;
    cubemap.m_last_error.m_buf_size = 0;
    cubemap.m_last_error.m_len = 0;
    cubemap.m_last_error.m_pStr = (char *)0x0;
    init(&cubemap,(EVP_PKEY_CTX *)(ulong)uVar15);
    lVar16 = 0;
    do {
      tmp_img.m_width = 0;
      tmp_img.m_height = 0;
      tmp_img.m_pitch = 0;
      tmp_img.m_total = 0;
      tmp_img.m_comp_flags = 0xf;
      tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
      tmp_img.m_pixel_buf.m_size = 0;
      tmp_img.m_pixel_buf.m_capacity = 0;
      piVar6 = mip_level::get_unpacked_image(*((this->m_faces).m_p)->m_p,&tmp_img,3);
      if (3 < uVar1) {
        iVar2 = (&g_vertical_cross_image_offsets)[lVar16 * 2];
        iVar7 = (&DAT_001a0944)[lVar16 * 2] * uVar15;
        piVar3 = (*(this->m_faces).m_p[lVar16].m_p)->m_pImage;
        uVar8 = 0;
        iVar9 = uVar15 - 1;
        do {
          iVar12 = 0;
          iVar10 = iVar2 * uVar15;
          iVar11 = uVar15 - 1;
          do {
            if (lVar16 == 5) {
              uVar13 = piVar3->m_pitch * iVar9 + iVar11;
            }
            else {
              uVar13 = piVar3->m_pitch * uVar8 + iVar12;
            }
            uVar14 = piVar6->m_pitch * iVar7 + iVar10;
            pcVar4 = piVar6->m_pPixels;
            pcVar5 = piVar3->m_pPixels;
            pcVar5[uVar13].field_0.field_0.r = pcVar4[uVar14].field_0.field_0.r;
            pcVar5[uVar13].field_0.field_0.g = pcVar4[uVar14].field_0.field_0.g;
            pcVar5[uVar13].field_0.field_0.b = pcVar4[uVar14].field_0.field_0.b;
            pcVar5[uVar13].field_0.field_0.a = pcVar4[uVar14].field_0.field_0.a;
            iVar12 = iVar12 + 1;
            iVar10 = iVar10 + 1;
            bVar17 = iVar11 != 0;
            iVar11 = iVar11 + -1;
          } while (bVar17);
          uVar8 = uVar8 + 1;
          iVar9 = iVar9 + -1;
          iVar7 = iVar7 + 1;
        } while (uVar8 != uVar15);
      }
      if (tmp_img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
        crnlib_free(tmp_img.m_pixel_buf.m_p);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    swap(this,&cubemap);
    ~mipmapped_texture(&cubemap);
  }
  return bVar18;
}

Assistant:

bool mipmapped_texture::vertical_cross_to_cubemap() {
  if (!is_vertical_cross())
    return false;

  const uint face_width = get_height() / 4;

  bool alpha_is_valid = has_alpha();

  mipmapped_texture cubemap;

  pixel_format fmt = alpha_is_valid ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;

  cubemap.init(face_width, face_width, 1, 6, fmt, m_name.get_ptr(), cDefaultOrientationFlags);

  // +x -x +y -y +z -z
  //     0  1  2
  // 0     +y
  // 1  -x +z +x
  // 2     -y
  // 3     -z

  for (uint face_index = 0; face_index < 6; face_index++) {
    const mip_level* pSrc = get_level(0, 0);

    image_u8 tmp_img;
    image_u8* pSrc_image = pSrc->get_unpacked_image(tmp_img, cUnpackFlagUncook | cUnpackFlagUnflip);

    const mip_level* pDst = get_level(face_index, 0);
    image_u8* pDst_image = pDst->get_image();
    CRNLIB_ASSERT(pDst_image);

    const bool flipped = (face_index == 5);
    const uint x_ofs = g_vertical_cross_image_offsets[face_index][0] * face_width;
    const uint y_ofs = g_vertical_cross_image_offsets[face_index][1] * face_width;

    for (uint y = 0; y < face_width; y++) {
      for (uint x = 0; x < face_width; x++) {
        const color_quad_u8& c = (*pSrc_image)(x_ofs + x, y_ofs + y);

        if (!flipped)
          (*pDst_image)(x, y) = c;
        else
          (*pDst_image)(face_width - 1 - x, face_width - 1 - y) = c;
      }
    }
  }

  swap(cubemap);

  CRNLIB_ASSERT(check());

  return true;
}